

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

_Bool prep_memory(Instance *instance)

{
  Vec2d *pVVar1;
  double *pdVar2;
  double *pdVar3;
  size_t __nmemb;
  
  __nmemb = (long)instance->num_customers + 1;
  pVVar1 = (Vec2d *)calloc(__nmemb,0x10);
  instance->positions = pVVar1;
  pdVar2 = (double *)calloc(__nmemb,8);
  instance->demands = pdVar2;
  pdVar3 = (double *)calloc(__nmemb,8);
  instance->profits = pdVar3;
  return pVVar1 != (Vec2d *)0x0 && (pdVar3 != (double *)0x0 && pdVar2 != (double *)0x0);
}

Assistant:

static bool prep_memory(Instance *instance) {

    instance->positions =
        calloc(instance->num_customers + 1, sizeof(*instance->positions));

    instance->demands =
        calloc(instance->num_customers + 1, sizeof(*instance->demands));

    instance->profits =
        calloc(instance->num_customers + 1, sizeof(*instance->profits));

    return instance->positions && instance->demands && instance->profits;
}